

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
  *this_00;
  uint *puVar1;
  undefined8 uVar2;
  vec<2U,_float> *p;
  raw_node *prVar3;
  uint new_hash_size;
  long lVar4;
  value_type vVar5;
  value_type vVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  uint32 uVar9;
  vq_node *pvVar10;
  ulong uVar11;
  executable_task *pObj;
  raw_node *prVar12;
  uint uVar13;
  vq_node *pvVar14;
  ulong uVar15;
  uint uVar16;
  undefined7 in_register_00000089;
  int iVar17;
  uint uVar18;
  uint64 data;
  ulong uVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
  params;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  alternative_node_queue;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  node_queue;
  uint local_ac;
  undefined1 local_a8 [8];
  float afStack_a0 [2];
  ulong local_98;
  int local_8c;
  undefined1 local_88 [16];
  bool local_78;
  node_vec_type *local_68;
  int local_60;
  undefined4 local_5c;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  local_58;
  elemental_vector *local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000089,generate_node_index_map);
  this->m_vectors = vectors;
  uVar16 = (this->m_vectorsInfo).m_size;
  if (uVar16 != size) {
    if ((uVar16 <= size) && ((this->m_vectorsInfo).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfo,size,uVar16 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfo).m_size = size;
  }
  uVar16 = (this->m_weightedVectors).m_size;
  if (uVar16 != size) {
    if ((uVar16 <= size) && ((this->m_weightedVectors).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_weightedVectors,size,uVar16 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_weightedVectors).m_size = size;
  }
  uVar16 = (this->m_weightedDotProducts).m_size;
  if (uVar16 != size) {
    if (uVar16 <= size) {
      if ((this->m_weightedDotProducts).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_weightedDotProducts,size,uVar16 + 1 == size,8,
                   (object_mover)0x0,false);
      }
      uVar16 = (this->m_weightedDotProducts).m_size;
      memset((this->m_weightedDotProducts).m_p + uVar16,0,(ulong)(size - uVar16) << 3);
    }
    (this->m_weightedDotProducts).m_size = size;
  }
  uVar16 = (this->m_vectorsInfoLeft).m_size;
  if (uVar16 != size) {
    if ((uVar16 <= size) && ((this->m_vectorsInfoLeft).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoLeft,size,uVar16 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoLeft).m_size = size;
  }
  uVar16 = (this->m_vectorsInfoRight).m_size;
  if (uVar16 != size) {
    if ((uVar16 <= size) && ((this->m_vectorsInfoRight).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoRight,size,uVar16 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoRight).m_size = size;
  }
  uVar16 = (this->m_vectorComparison).m_size;
  if (uVar16 != size) {
    if (uVar16 <= size) {
      if ((this->m_vectorComparison).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_vectorComparison,size,uVar16 + 1 == size,1,
                   (object_mover)0x0,false);
      }
      uVar16 = (this->m_vectorComparison).m_size;
      memset((this->m_vectorComparison).m_p + uVar16,0,(ulong)(size - uVar16));
    }
    (this->m_vectorComparison).m_size = size;
  }
  local_68 = &this->m_nodes;
  uVar18 = max_splits * 4;
  uVar16 = (this->m_nodes).m_size;
  if (uVar16 != uVar18) {
    if (uVar16 <= uVar18) {
      if ((this->m_nodes).m_capacity < uVar18) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_68,uVar18,uVar16 + 1 == uVar18,0x30,
                   vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover,
                   false);
      }
      uVar16 = (this->m_nodes).m_size;
      uVar13 = uVar18 - uVar16;
      if (uVar13 != 0) {
        pvVar10 = (this->m_nodes).m_p + uVar16;
        pvVar14 = pvVar10 + uVar13;
        do {
          *(undefined8 *)(pvVar10->m_centroid).m_s = 0;
          pvVar10->m_total_weight = 0;
          pvVar10->m_left = -1;
          pvVar10->m_right = -1;
          pvVar10->m_codebook_index = -1;
          pvVar10->m_unsplittable = false;
          pvVar10->m_alternative = false;
          pvVar10->m_processed = false;
          pvVar10 = pvVar10 + 1;
        } while (pvVar10 != pvVar14);
      }
    }
    (this->m_nodes).m_size = uVar18;
  }
  p = (this->m_codebook).m_p;
  if (p != (vec<2U,_float> *)0x0) {
    crnlib_free(p);
    (this->m_codebook).m_p = (vec<2U,_float> *)0x0;
    (this->m_codebook).m_size = 0;
    (this->m_codebook).m_capacity = 0;
  }
  if (pTask_pool == (task_pool *)0x0) {
    uVar19 = 1;
  }
  else {
    uVar19 = (ulong)(pTask_pool->m_num_threads + 1);
  }
  if ((this->m_vectorsInfo).m_size == 0) {
    dVar23 = 0.0;
    fVar21 = 0.0;
    fVar22 = 0.0;
    uVar11 = 0;
  }
  else {
    dVar23 = 0.0;
    fVar21 = 0.0;
    fVar22 = 0.0;
    uVar11 = 0;
    uVar15 = 0;
    do {
      (this->m_vectorsInfo).m_p[uVar15].index = (uint)uVar15;
      uVar16 = weights[uVar15];
      (this->m_vectorsInfo).m_p[uVar15].weight = uVar16;
      fVar24 = (float)uVar16;
      *(ulong *)(this->m_weightedVectors).m_p[uVar15].m_s =
           CONCAT44((float)((ulong)*(undefined8 *)vectors[uVar15].m_s >> 0x20) * fVar24,
                    (float)*(undefined8 *)vectors[uVar15].m_s * fVar24);
      uVar2 = *(undefined8 *)(this->m_weightedVectors).m_p[uVar15].m_s;
      fVar21 = fVar21 + (float)uVar2;
      fVar22 = fVar22 + (float)((ulong)uVar2 >> 0x20);
      fVar25 = (float)*(undefined8 *)vectors[uVar15].m_s;
      fVar26 = (float)((ulong)*(undefined8 *)vectors[uVar15].m_s >> 0x20);
      (this->m_weightedDotProducts).m_p[uVar15] =
           (double)((fVar26 * fVar26 + fVar25 * fVar25) * fVar24);
      dVar23 = dVar23 + (this->m_weightedDotProducts).m_p[uVar15];
      uVar11 = uVar11 + uVar16;
      uVar15 = uVar15 + 1;
    } while (uVar15 < (this->m_vectorsInfo).m_size);
  }
  fVar24 = (float)(dVar23 - (double)((fVar22 * fVar22 + fVar21 * fVar21) / (float)uVar11));
  fVar25 = 1.0 / (float)uVar11;
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ac = 0;
  pvVar10 = local_68->m_p;
  *(ulong *)(pvVar10->m_centroid).m_s = CONCAT44(fVar25 * fVar22,fVar25 * fVar21);
  pvVar10->m_total_weight = uVar11;
  pvVar10->m_variance = fVar24;
  pvVar10->m_begin = 0;
  pvVar10->m_end = size;
  pvVar10->m_left = -1;
  pvVar10->m_right = -1;
  pvVar10->m_codebook_index = -1;
  pvVar10->m_unsplittable = false;
  pvVar10->m_alternative = false;
  pvVar10->m_processed = false;
  local_88._0_8_ = (ulong)(uint)fVar24 << 0x20;
  local_38 = (elemental_vector *)&this->m_codebook;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ::push(&local_58,(value_type *)local_88);
  local_ac = local_ac + 1;
  uVar18 = 1;
  uVar13 = (uint)uVar19;
  uVar16 = uVar18;
  if (1 < uVar13) {
    local_98 = (ulong)max_splits;
    if (1 < max_splits) {
      do {
        uVar16 = uVar18;
        if (((long)local_58.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_58.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar19) ||
           (bVar8 = split_node(this,&local_58,&local_ac,pTask_pool), !bVar8)) break;
        uVar18 = uVar18 + 1;
        uVar16 = (uint)local_98;
      } while ((uint)local_98 != uVar18);
    }
    if ((long)local_58.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_58.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar19) {
      std::
      vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ::vector((vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                *)local_88,&local_58.c);
      local_8c = (int)((local_98 & 0xffffffff) / uVar19);
      local_a8._0_4_ = 0.0;
      local_a8._4_4_ = 0.0;
      afStack_a0[0] = 0.0;
      afStack_a0[1] = 0.0;
      elemental_vector::increase_capacity
                ((elemental_vector *)local_a8,uVar13,false,0xc,(object_mover)0x0,false);
      afStack_a0[0] = (float)uVar13;
      vVar5.m_variance = (float)local_88._12_4_;
      vVar5.m_index = local_88._8_4_;
      if ((value_type)local_88._0_8_ != vVar5) {
        iVar17 = (int)local_98 * 2;
        local_60 = local_8c * 2;
        data = 0;
        do {
          auVar7 = local_a8;
          lVar4 = data * 0xc;
          *(undefined4 *)((long)local_a8 + lVar4) = *(undefined4 *)local_88._0_8_;
          *(int *)((long)local_a8 + 4 + lVar4) = iVar17;
          *(int *)((long)local_a8 + 8 + lVar4) = local_8c;
          pObj = (executable_task *)crnlib_malloc(0x28);
          pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001de9d0;
          pObj[1]._vptr_executable_task = (_func_int **)this;
          pObj[2]._vptr_executable_task = (_func_int **)split_alternative_node_task;
          pObj[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
          task_pool::queue_task(pTask_pool,pObj,data,(void *)((long)auVar7 + data * 0xc));
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
          ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                 *)local_88);
          iVar17 = iVar17 + local_60;
          data = (uint64)((int)data + 1);
          vVar6.m_variance = (float)local_88._12_4_;
          vVar6.m_index = local_88._8_4_;
        } while ((value_type)local_88._0_8_ != vVar6);
      }
      task_pool::join(pTask_pool);
      max_splits = (uint)local_98;
      if ((float  [2])local_a8 != (float  [2])0x0) {
        crnlib_free((void *)local_a8);
      }
      if ((value_type)local_88._0_8_ != (value_type)0x0) {
        operator_delete((void *)local_88._0_8_);
      }
    }
    else {
      max_splits = (uint)local_98;
    }
  }
  if (uVar16 < max_splits) {
    iVar17 = ~uVar16 + max_splits;
    do {
      bVar8 = split_node(this,&local_58,&local_ac,pTask_pool);
      bVar20 = iVar17 != 0;
      iVar17 = iVar17 + -1;
    } while (bVar8 && bVar20);
  }
  if (local_ac != 0) {
    this_00 = &this->m_node_index_map;
    uVar19 = 0;
    do {
      pvVar10 = local_68->m_p;
      if ((pvVar10[uVar19].m_alternative != false) || (pvVar10[uVar19].m_left == -1)) {
        pvVar10 = pvVar10 + uVar19;
        pvVar10->m_codebook_index = (this->m_codebook).m_size;
        uVar16 = (this->m_codebook).m_size;
        if ((this->m_codebook).m_capacity <= uVar16) {
          elemental_vector::increase_capacity(local_38,uVar16 + 1,true,8,(object_mover)0x0,false);
        }
        *(undefined8 *)(this->m_codebook).m_p[(this->m_codebook).m_size].m_s =
             *(undefined8 *)(pvVar10->m_centroid).m_s;
        puVar1 = &(this->m_codebook).m_size;
        *puVar1 = *puVar1 + 1;
        if (((char)local_5c != '\0') &&
           (uVar11 = (ulong)pvVar10->m_begin, pvVar10->m_begin < pvVar10->m_end)) {
          do {
            local_a8 = *(undefined1 (*) [8])
                        this->m_vectors[(this->m_vectorsInfo).m_p[uVar11].index].m_s;
            afStack_a0[0] = (float)pvVar10->m_codebook_index;
            local_88._0_4_ = 0;
            local_88._4_4_ = 0.0;
            local_88._8_4_ = 0;
            local_78 = false;
            if ((this->m_node_index_map).m_values.m_size == 0) {
LAB_0018b380:
              new_hash_size = (this->m_node_index_map).m_values.m_size * 2;
              if (new_hash_size < 5) {
                new_hash_size = 4;
              }
              hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
              ::rehash(this_00,new_hash_size);
              bVar8 = hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
                      ::insert_no_grow(this_00,(insert_result *)local_88,(vec<2U,_float> *)local_a8,
                                       (uint *)afStack_a0);
              if (!bVar8) {
                crnlib_fail("\"insert() failed\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_hash_map.h"
                            ,0x15d);
              }
            }
            else {
              uVar9 = fast_hash((vec<2U,_float> *)local_a8,8);
              uVar16 = uVar9 * -0x61c88647 >> ((byte)(this->m_node_index_map).m_hash_shift & 0x1f);
              prVar3 = (this->m_node_index_map).m_values.m_p;
              prVar12 = prVar3 + uVar16;
              if (prVar3[uVar16].m_bits[0xc] == '\0') {
LAB_0018b341:
                if ((this->m_node_index_map).m_grow_threshold <=
                    (this->m_node_index_map).m_num_valid) goto LAB_0018b380;
                *(undefined1 (*) [8])prVar12->m_bits = local_a8;
                *(float *)(prVar12->m_bits + 8) = afStack_a0[0];
                prVar12->m_bits[0xc] = '\x01';
                puVar1 = &(this->m_node_index_map).m_num_valid;
                *puVar1 = *puVar1 + 1;
                local_78 = true;
                local_88._0_8_ = this_00;
                local_88._8_4_ = uVar16;
              }
              else if ((*(float *)prVar12->m_bits != (float)local_a8._0_4_) ||
                      (NAN(*(float *)prVar12->m_bits) || NAN((float)local_a8._0_4_))) {
LAB_0018b2ac:
                uVar18 = (this->m_node_index_map).m_values.m_size - 1;
                uVar15 = (ulong)(uVar16 - 1);
                if (uVar16 == 0) {
                  uVar15 = (ulong)uVar18;
                }
                uVar13 = (uint)uVar15;
                prVar12 = prVar12 + -1;
                if (uVar16 == 0) {
                  prVar12 = prVar3 + uVar18;
                }
                while (uVar16 != uVar13) {
                  uVar13 = (uint)uVar15;
                  bVar8 = prVar12->m_bits[0xc] == '\0';
                  if (bVar8) goto LAB_0018b2d3;
                  if ((*(float *)prVar12->m_bits == (float)local_a8._0_4_) &&
                     (!NAN(*(float *)prVar12->m_bits) && !NAN((float)local_a8._0_4_))) {
                    bVar8 = false;
                    do {
                      bVar20 = bVar8;
                      if (bVar20) goto LAB_0018b327;
                    } while ((*(float *)(prVar12->m_bits + 4) == (float)local_a8._4_4_) &&
                            (bVar8 = true,
                            !NAN(*(float *)(prVar12->m_bits + 4)) && !NAN((float)local_a8._4_4_)));
                    if (bVar20) {
LAB_0018b327:
                      local_78 = false;
                      bVar20 = true;
                      bVar8 = false;
                      uVar16 = uVar13;
                      local_88._0_8_ = this_00;
                      local_88._8_4_ = uVar13;
                      goto LAB_0018b33a;
                    }
                  }
                  bVar8 = uVar13 == 0;
                  uVar13 = uVar13 - 1;
                  if (bVar8) {
                    uVar13 = uVar18;
                  }
                  uVar15 = (ulong)uVar13;
                  prVar12 = prVar12 + -1;
                  if (bVar8) {
                    prVar12 = prVar3 + uVar18;
                  }
                }
                bVar8 = false;
LAB_0018b2d3:
                bVar20 = false;
                uVar16 = uVar13;
LAB_0018b33a:
                if (bVar8) goto LAB_0018b341;
                if (!bVar20) goto LAB_0018b380;
              }
              else {
                bVar8 = false;
                do {
                  bVar20 = bVar8;
                  if (bVar20) goto LAB_0018b2a5;
                } while ((*(float *)(prVar12->m_bits + 4) == (float)local_a8._4_4_) &&
                        (bVar8 = true,
                        !NAN(*(float *)(prVar12->m_bits + 4)) && !NAN((float)local_a8._4_4_)));
                if (!bVar20) goto LAB_0018b2ac;
LAB_0018b2a5:
                local_78 = false;
                local_88._0_8_ = this_00;
                local_88._8_4_ = uVar16;
              }
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < pvVar10->m_end);
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < local_ac);
  }
  if (local_58.c.
      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.c.
                    super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0) {
    m_vectors = vectors;
    m_vectorsInfo.resize(size);
    m_weightedVectors.resize(size);
    m_weightedDotProducts.resize(size);
    m_vectorsInfoLeft.resize(size);
    m_vectorsInfoRight.resize(size);
    m_vectorComparison.resize(size);
    m_nodes.resize(max_splits << 2);
    m_codebook.clear();
    uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

    vq_node root;
    root.m_begin = 0;
    root.m_end = size;
    double ttsum = 0.0f;
    for (uint i = 0; i < m_vectorsInfo.size(); i++) {
      const VectorType& v = vectors[i];
      m_vectorsInfo[i].index = i;
      const uint weight = m_vectorsInfo[i].weight = weights[i];
      m_weightedVectors[i] = v * (float)weight;
      root.m_centroid += m_weightedVectors[i];
      root.m_total_weight += weight;
      m_weightedDotProducts[i] = v.dot(v) * weight;
      ttsum += m_weightedDotProducts[i];
    }
    root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
    root.m_centroid *= (1.0f / root.m_total_weight);

    std::priority_queue<NodeInfo> node_queue;
    uint begin_node = 0, end_node = begin_node, splits = 0;
    m_nodes[end_node] = root;
    node_queue.push(NodeInfo(end_node, root.m_variance));
    end_node++;
    splits++;

    if (num_tasks > 1) {
      while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
        splits++;
      if (node_queue.size() == num_tasks) {
        std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
        uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
        crnlib::vector<split_alternative_node_task_params> params(num_tasks);
        for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++) {
          params[task].main_node = alternative_node_queue.top().m_index;
          params[task].alternative_node = alternative_node;
          params[task].max_splits = alternative_max_splits;
          pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
        }
        pTask_pool->join();
      }
    }

    while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
      splits++;

    for (uint i = begin_node; i < end_node; i++) {
      vq_node& node = m_nodes[i];
      if (!node.m_alternative && node.m_left != -1)
        continue;
      node.m_codebook_index = m_codebook.size();
      m_codebook.push_back(node.m_centroid);
      if (generate_node_index_map) {
        for (uint j = node.m_begin; j < node.m_end; j++)
          m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
      }
    }
  }